

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_sqadd_u8_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  uint32_t uVar1;
  int32_t iVar2;
  uint32_t uVar3;
  short local_1e;
  uint32_t r;
  int16_t vr;
  int16_t vb;
  int16_t va;
  uint32_t b_local;
  uint32_t a_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = extract32(a,0,8);
  iVar2 = sextract32(b,0,8);
  local_1e = (short)uVar1 + (short)iVar2;
  if (local_1e < 0x80) {
    if (local_1e < -0x80) {
      (env->vfp).qc[0] = 1;
      local_1e = -0x80;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0x7f;
  }
  uVar1 = deposit32(0,0,8,(int)local_1e);
  uVar3 = extract32(a,8,8);
  iVar2 = sextract32(b,8,8);
  local_1e = (short)uVar3 + (short)iVar2;
  if (local_1e < 0x80) {
    if (local_1e < -0x80) {
      (env->vfp).qc[0] = 1;
      local_1e = -0x80;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0x7f;
  }
  uVar1 = deposit32(uVar1,8,8,(int)local_1e);
  uVar3 = extract32(a,0x10,8);
  iVar2 = sextract32(b,0x10,8);
  local_1e = (short)uVar3 + (short)iVar2;
  if (local_1e < 0x80) {
    if (local_1e < -0x80) {
      (env->vfp).qc[0] = 1;
      local_1e = -0x80;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0x7f;
  }
  uVar1 = deposit32(uVar1,0x10,8,(int)local_1e);
  uVar3 = extract32(a,0x18,8);
  iVar2 = sextract32(b,0x18,8);
  local_1e = (short)uVar3 + (short)iVar2;
  if (local_1e < 0x80) {
    if (local_1e < -0x80) {
      (env->vfp).qc[0] = 1;
      local_1e = -0x80;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_1e = 0x7f;
  }
  uVar1 = deposit32(uVar1,0x18,8,(int)local_1e);
  return uVar1;
}

Assistant:

uint32_t HELPER(neon_sqadd_u8)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int16_t va, vb, vr;
    uint32_t r = 0;

    SSATACC(8, 0);
    SSATACC(8, 8);
    SSATACC(8, 16);
    SSATACC(8, 24);
    return r;
}